

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::Read3dmEndMark(ON_BinaryArchive *this,size_t *file_length)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  ON__UINT64 local_40;
  ON__UINT64 u64;
  bool rc;
  ulong uStack_30;
  uint saved_error_message_mask;
  ON__INT64 value;
  size_t *psStack_20;
  uint tcode;
  size_t *file_length_local;
  ON_BinaryArchive *this_local;
  
  psStack_20 = file_length;
  file_length_local = (size_t *)this;
  bVar2 = Begin3dmTable(this,read3dm,end_mark);
  if (bVar2) {
    value._4_4_ = 0;
    uStack_30 = 0;
    if (psStack_20 != (size_t *)0x0) {
      *psStack_20 = 0;
    }
    u64._4_4_ = this->m_error_message_mask;
    this->m_error_message_mask = this->m_error_message_mask | 1;
    u64._3_1_ = PeekAt3dmBigChunkType
                          (this,(ON__UINT32 *)((long)&value + 4),
                           (ON__INT64 *)&stack0xffffffffffffffd0);
    this->m_error_message_mask = u64._4_4_;
    if ((bool)u64._3_1_) {
      if ((((value._4_4_ == 0x7fff) &&
           (u64._3_1_ = BeginRead3dmBigChunk
                                  (this,(uint *)((long)&value + 4),
                                   (ON__INT64 *)&stack0xffffffffffffffd0), uVar1 = uStack_30,
           (bool)u64._3_1_)) && (0 < (long)uStack_30)) &&
         (sVar3 = SizeofChunkLength(this), sVar3 <= uVar1)) {
        local_40 = 0;
        u64._3_1_ = ReadEOFSizeOfFile(this,&local_40);
        if (((bool)u64._3_1_) && (psStack_20 != (size_t *)0x0)) {
          *psStack_20 = local_40;
        }
        this->m_3dm_end_mark_length = local_40;
        bVar2 = EndRead3dmChunk(this);
        if (!bVar2) {
          u64._3_1_ = 0;
        }
      }
    }
    else if (this->m_3dm_version == 1) {
      u64._3_1_ = 1;
    }
    this_local._7_1_ = End3dmTable(this,end_mark,(bool)(u64._3_1_ & 1));
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::Read3dmEndMark( size_t* file_length )
{
  if (false == Begin3dmTable(ON::archive_mode::read3dm,ON_3dmArchiveTableType::end_mark))
    return false;

  unsigned int tcode=0;
  ON__INT64 value=0;
  if ( file_length )
    *file_length = 0;

  const unsigned int saved_error_message_mask = m_error_message_mask;
  m_error_message_mask |= 0x0001; // disable v1 ReadByte() error message at EOF
  bool rc = PeekAt3dmBigChunkType(&tcode,&value);
  m_error_message_mask = saved_error_message_mask;

  if (rc)
  {
    if ( tcode == TCODE_ENDOFFILE ) 
    {
      rc = BeginRead3dmBigChunk(&tcode,&value);
      if ( rc && value > 0 && ((ON__UINT64)value) >= SizeofChunkLength() )
      {
        ON__UINT64 u64 = 0;
        rc = ReadEOFSizeOfFile( &u64 );
        if ( rc && file_length )
          *file_length = (size_t)u64;
        m_3dm_end_mark_length = u64;
        if ( !EndRead3dmChunk() )
          rc = false;
      }
    }
  }
  else if (1 == m_3dm_version)
  {
    // 2015-Nov-13 Dale Lear
    // The end chunk is missing in some V1 files.  It's 20 years later and this error is not helpful.
    rc = true;
  }

  return End3dmTable(ON_3dmArchiveTableType::end_mark,rc);
}